

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflickgesture.cpp
# Opt level: O2

void __thiscall PressDelayHandler::sendMouseEvent(PressDelayHandler *this,QMouseEvent *me,int flags)

{
  undefined2 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  long lVar5;
  Data *pDVar6;
  bool bVar7;
  undefined4 uVar8;
  QGraphicsView *this_00;
  QGraphicsScene *pQVar9;
  QGraphicsScene *this_01;
  QGraphicsItem *this_02;
  QWidget *pQVar10;
  undefined8 uVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  QPointF QVar13;
  qreal local_d8;
  qreal local_d0;
  QPointF local_c8;
  qreal local_b8;
  qreal local_b0;
  QPointF local_a8;
  qreal local_98;
  qreal local_90;
  QMouseEvent copy;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = QPointer::operator_cast_to_bool((QPointer *)&this->mouseTarget);
  if (!bVar7) goto LAB_005d9a60;
  this->sendingEvent = true;
  if (((this->mouseTarget).wp.d == (Data *)0x0) ||
     (pQVar12 = *(QObject **)(*(long *)((this->mouseTarget).wp.value + 8) + 0x10),
     pQVar12 == (QObject *)0x0)) {
LAB_005d98b1:
    this_02 = (QGraphicsItem *)0x0;
  }
  else {
    this_00 = (QGraphicsView *)QtPrivate::qobject_cast_helper<QGraphicsView*,QObject>(pQVar12);
    if (this_00 == (QGraphicsView *)0x0) goto LAB_005d98b1;
    pQVar9 = QGraphicsView::scene(this_00);
    if (pQVar9 == (QGraphicsScene *)0x0) goto LAB_005d98b1;
    this_01 = (QGraphicsScene *)QGraphicsView::scene(this_00);
    this_02 = QGraphicsScene::mouseGrabberItem(this_01);
  }
  if (((flags & 1U) != 0) && (this_02 != (QGraphicsItem *)0x0)) {
    QGraphicsItem::ungrabMouse(this_02);
  }
  if (me != (QMouseEvent *)0x0) {
    _copy = &DAT_aaaaaaaaaaaaaaaa;
    uVar1 = *(undefined2 *)(me + 8);
    pDVar6 = (this->mouseTarget).wp.d;
    if ((pDVar6 == (Data *)0x0) || (*(int *)(pDVar6 + 4) == 0)) {
      pQVar10 = (QWidget *)0x0;
    }
    else {
      pQVar10 = (QWidget *)(this->mouseTarget).wp.value;
    }
    QVar13 = QSinglePointEvent::globalPosition((QSinglePointEvent *)me);
    local_a8.yp = QVar13.yp;
    local_a8.xp = QVar13.xp;
    QVar13 = QWidget::mapFromGlobal(pQVar10,&local_a8);
    local_90 = QVar13.yp;
    local_98 = QVar13.xp;
    pQVar10 = QWidget::window((QWidget *)(this->mouseTarget).wp.value);
    QVar13 = QSinglePointEvent::globalPosition((QSinglePointEvent *)me);
    local_c8.yp = QVar13.yp;
    local_c8.xp = QVar13.xp;
    QVar13 = QWidget::mapFromGlobal(pQVar10,&local_c8);
    local_b0 = QVar13.yp;
    local_b8 = QVar13.xp;
    QVar13 = QSinglePointEvent::globalPosition((QSinglePointEvent *)me);
    local_d0 = QVar13.yp;
    local_d8 = QVar13.xp;
    uVar2 = *(undefined4 *)(me + 0x20);
    uVar3 = *(undefined4 *)(me + 0x40);
    uVar4 = *(undefined4 *)(me + 0x44);
    uVar8 = QMouseEvent::source();
    uVar11 = QPointerEvent::pointingDevice();
    QMouseEvent::QMouseEvent
              (&copy,uVar1,&local_98,&local_b8,&local_d8,uVar3,uVar4,uVar2,uVar8,uVar11);
    QPointerEvent::setTimestamp((ulonglong)&copy);
    pDVar6 = (this->mouseTarget).wp.d;
    if (pDVar6 == (Data *)0x0) {
      pQVar12 = (QObject *)0x0;
    }
    else if (*(int *)(pDVar6 + 4) == 0) {
      pQVar12 = (QObject *)0x0;
    }
    else {
      pQVar12 = (this->mouseTarget).wp.value;
    }
    qt_sendSpontaneousEvent(pQVar12,(QEvent *)&copy);
    QMouseEvent::~QMouseEvent(&copy);
  }
  if (((flags & 2U) != 0) && (this_02 != (QGraphicsItem *)0x0)) {
    QGraphicsItem::grabMouse(this_02);
  }
  this->sendingEvent = false;
LAB_005d9a60:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void sendMouseEvent(QMouseEvent *me, int flags = 0)
    {
        if (mouseTarget) {
            sendingEvent = true;

#if QT_CONFIG(graphicsview)
            QGraphicsItem *grabber = nullptr;
            if (mouseTarget->parentWidget()) {
                if (QGraphicsView *gv = qobject_cast<QGraphicsView *>(mouseTarget->parentWidget())) {
                    if (gv->scene())
                        grabber = gv->scene()->mouseGrabberItem();
                }
            }

            if (grabber && (flags & UngrabMouseBefore)) {
                // GraphicsView Mouse Handling Workaround #1:
                // we need to ungrab the mouse before re-sending the press,
                // since the scene had already set the mouse grabber to the
                // original (and consumed) event's receiver
                qFGDebug() << "QFG: ungrabbing" << grabber;
                grabber->ungrabMouse();
            }
#else
            Q_UNUSED(flags);
#endif // QT_CONFIG(graphicsview)

            if (me) {
                QMouseEvent copy(me->type(), mouseTarget->mapFromGlobal(me->globalPosition()),
                                 mouseTarget->topLevelWidget()->mapFromGlobal(me->globalPosition()), me->globalPosition(),
                                 me->button(), me->buttons(), me->modifiers(),
                                 me->source(), me->pointingDevice());
                copy.setTimestamp(me->timestamp());
                qt_sendSpontaneousEvent(mouseTarget, &copy);
            }

#if QT_CONFIG(graphicsview)
            if (grabber && (flags & RegrabMouseAfterwards)) {
                // GraphicsView Mouse Handling Workaround #2:
                // we need to re-grab the mouse after sending a faked mouse
                // release, since we still need the mouse moves for the gesture
                // (the scene will clear the item's mouse grabber status on
                // release).
                qFGDebug() << "QFG: re-grabbing" << grabber;
                grabber->grabMouse();
            }
#endif
            sendingEvent = false;
        }
    }